

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Signal_PDU::Signal_PDU(Signal_PDU *this)

{
  Signal_PDU *this_local;
  
  Radio_Communications_Header::Radio_Communications_Header(&this->super_Radio_Communications_Header)
  ;
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Signal_PDU_00501ee0;
  DATA_TYPE::EncodingScheme::EncodingScheme(&this->m_EncodingScheme);
  this->m_ui32SampleRate = 0;
  this->m_ui16DataLength = 0;
  this->m_ui16Samples = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vData);
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x1a';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  return;
}

Assistant:

Signal_PDU::Signal_PDU() :
    m_ui32SampleRate( 0 ),
    m_ui16DataLength( 0 ),
    m_ui16Samples( 0 )
{
    m_ui8PDUType = Signal_PDU_Type;
    m_ui16PDULength = SIGNAL_PDU_SIZE;
}